

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  char cVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  long *plVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int k_7;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  _func_int **pp_Var14;
  Layer *pLVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *pvVar19;
  long lVar20;
  byte bVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  byte bVar25;
  int p_1;
  int iVar26;
  uint uVar27;
  long lVar28;
  undefined4 *puVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  _func_int *p_Var33;
  long lVar34;
  int k_2;
  long lVar35;
  uint _w;
  _func_int **pp_Var36;
  void *pvVar37;
  int k_1;
  _func_int **pp_Var38;
  int k_8;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int k_4;
  int iVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  int k;
  _func_int **pp_Var48;
  long lVar49;
  undefined4 *puVar50;
  undefined4 *puVar51;
  int i;
  Mat *pMVar52;
  long lVar53;
  long lVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  ulong uVar58;
  long lVar59;
  undefined4 *puVar60;
  ulong uVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  ulong uVar65;
  long lVar66;
  long lVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint local_240;
  long local_230;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  ParamDict pd_6;
  ParamDict pd;
  size_t local_1b8;
  Allocator *local_1a8;
  int iStack_1a0;
  int iStack_19c;
  undefined8 uStack_198;
  int local_190 [2];
  size_t local_188 [2];
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_160;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 local_140;
  _func_int *local_130;
  long local_128;
  void *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  ParamDict pd_5;
  ModelBinFromMatArray local_60;
  int local_4c;
  long local_48;
  void *local_40;
  long local_38;
  
  pp_Var14 = this->_vptr_Convolution_x86_avx;
  p_Var33 = pp_Var14[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).allocator + (long)p_Var33) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var33)) {
  case 1:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 2:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 3:
    pLVar15 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 4:
    pLVar15 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 5:
    pLVar15 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 6:
    pLVar15 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)
                           ((long)&(this->weight_winograd43_data).allocator + (long)p_Var33));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).allocator +
                                             (long)p_Var33) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  default:
    pLVar15 = (Layer *)0x0;
    goto LAB_00206862;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar15->_vptr_Layer[4])(pLVar15,opt);
  pp_Var14 = this->_vptr_Convolution_x86_avx;
LAB_00206862:
  this->activation = pLVar15;
  this->nT = opt->num_threads;
  p_Var33 = pp_Var14[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).c + (long)p_Var33) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar22 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var33);
  iVar55 = *(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var33);
  iVar23 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var33);
  uVar24 = (long)*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)(p_Var33 + 4)) /
           (long)(iVar23 * iVar55);
  uVar24 = (long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) /
           (long)(int)uVar22;
  uVar46 = uVar24 & 0xffffffff;
  if ((((iVar55 == iVar23 && opt->use_packing_layout == false) &&
       (iVar11 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33), iVar11 != 1)) &&
      (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) == iVar11)) &&
     ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) == 1 &&
      (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) == 1)))) {
    pLVar15 = create_layer(6);
    this->convolution_dilation1 = pLVar15;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).dims +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).w +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).h +
                           (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)this->_vptr_Convolution_x86_avx[-3]));
    ParamDict::set(&pd_5,6,*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                   (long)(this->_vptr_Convolution_x86_avx[-3] + 4)));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var14 = this->_vptr_Convolution_x86_avx;
    if (*(int *)((long)&(this->weight_winograd43_data).elemsize + (long)pp_Var14[-3]) == 0) {
      local_188[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1a8 = (Allocator *)0x0;
      iStack_1a0 = 0;
      iStack_19c = 0;
      uStack_198._0_4_ = 0;
      uStack_198._4_4_ = 0;
      local_190[0] = 0;
      p_Var33 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_1a8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&this->gemm + (long)p_Var33);
        uStack_198 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_1a0 = (int)uVar7;
        iStack_19c = (int)((ulong)uVar7 >> 0x20);
        local_190[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_188[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1a8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_188[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_1a8 = (Allocator *)0x0;
      iStack_1a0 = 0;
      iStack_19c = 0;
      uStack_198._0_4_ = 0;
      uStack_198._4_4_ = 0;
      local_190[0] = 0;
      p_Var33 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        local_1a8 = *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&this->gemm + (long)p_Var33);
        uStack_198 = *(undefined8 *)((long)&(this->scale_in_data).data + (long)p_Var33);
        iStack_1a0 = (int)uVar7;
        iStack_19c = (int)((ulong)uVar7 >> 0x20);
        local_190[0] = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var33);
        local_188[0] = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var33);
        p_Var33 = this->_vptr_Convolution_x86_avx[-3];
      }
      local_140 = 0;
      local_148 = 0;
      uStack_150 = 0;
      uStack_154 = 0;
      uStack_158 = 0;
      local_160 = 0;
      local_168 = 0;
      local_170 = 0;
      uStack_174 = 0;
      uStack_178 = 0;
      local_188[1] = 0;
      if ((_func_int *)(local_188 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
        piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_188[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
        uStack_178 = (undefined4)uVar7;
        uStack_174 = (undefined4)((ulong)uVar7 >> 0x20);
        local_170 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var33);
        local_168 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
        local_160 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
        uStack_150 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var33);
        uStack_158 = (undefined4)uVar7;
        uStack_154 = (undefined4)((ulong)uVar7 >> 0x20);
        local_148 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
        local_140 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&pd_6);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&pd_6);
      lVar34 = 0x48;
      do {
        piVar2 = *(int **)((long)&pd.d + lVar34);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (*(long **)((long)&local_1a8 + lVar34) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar34));
            }
            else {
              (**(code **)(**(long **)((long)&local_1a8 + lVar34) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_188 + lVar34) = 0;
        *(undefined1 (*) [16])((long)&pd.d + lVar34 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar34) = (undefined1  [16])0x0;
        *(undefined4 *)((long)local_190 + lVar34) = 0;
        *(undefined1 (*) [16])((long)&iStack_1a0 + lVar34) = (undefined1  [16])0x0;
        lVar34 = lVar34 + -0x48;
      } while (lVar34 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var33 = this->_vptr_Convolution_x86_avx[-3];
      piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var33);
          if (plVar5 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var33));
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var33) = 0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).d + (long)p_Var33) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var33) =
           (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&this->gemm + (long)p_Var33) = (undefined1  [16])0x0;
      *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var33) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  if (opt->use_packing_layout == false) {
    uVar27 = 1;
    lVar34 = 1;
  }
  else {
    uVar27 = (uint)((uVar24 & 3) == 0) * 3 + 1;
    if ((uVar24 & 7) == 0) {
      uVar27 = 8;
    }
    lVar34 = (ulong)((uVar22 & 3) == 0) * 3 + 1;
    if ((uVar22 & 7) == 0) {
      lVar34 = 8;
    }
  }
  bVar25 = opt->use_winograd23_convolution;
  local_240 = (uint)uVar24;
  if ((((bool)bVar25 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar8 = false;
  }
  else {
    bVar8 = 8 < (int)uVar22 || 8 < (int)local_240;
  }
  if ((((iVar23 != 3) || (iVar55 != 3)) || (opt->use_winograd_convolution == false)) ||
     (((!bVar8 || (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var33) != 1)) ||
      ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var33) != 1 ||
       ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var33) != 1 ||
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var33) != 1)))))))) {
    iVar11 = get_cpu_level2_cache_size();
    local_130 = this->_vptr_Convolution_x86_avx[-3];
    uVar22 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)local_130);
    iVar55 = *(int *)((long)&(this->weight_winograd23_data).w + (long)local_130);
    auVar6 = *(undefined1 (*) [16])((long)&(this->weight_winograd23_data).h + (long)local_130);
    iVar23 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)local_130);
    iVar42 = auVar6._0_4_;
    iVar26 = auVar6._12_4_;
    uVar24 = (ulong)uVar27;
    lVar39 = (long)(int)local_240;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar11 < (int)(auVar6._4_4_ * uVar22 * iVar55 * iVar42 * auVar6._8_4_ * iVar26 * iVar23 *
                        local_240 * 8) || (0x10 < (int)local_240 || 0x10 < (int)uVar22))) ||
       (iVar42 == 1 && iVar55 == 1)) {
      pLVar15 = create_layer(0x4a);
      this->gemm = pLVar15;
      ParamDict::ParamDict(&pd_6);
      ParamDict::set(&pd_6,2,0);
      ParamDict::set(&pd_6,3,0);
      ParamDict::set(&pd_6,4,1);
      ParamDict::set(&pd_6,5,0);
      ParamDict::set(&pd_6,6,1);
      ParamDict::set(&pd_6,7,*(int *)((long)&(this->weight_winograd23_data).dims +
                                     (long)this->_vptr_Convolution_x86_avx[-3]));
      ParamDict::set(&pd_6,8,0);
      uVar22 = iVar42 * iVar55;
      ParamDict::set(&pd_6,9,local_240 * uVar22);
      ParamDict::set(&pd_6,10,-(uint)(*(int *)((long)&(this->weight_winograd43_data).elemsize +
                                              (long)this->_vptr_Convolution_x86_avx[-3]) == 0) | 1);
      ParamDict::set(&pd_6,0xb,1);
      (*this->gemm->_vptr_Layer[2])(this->gemm,&pd_6);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      pMVar52 = (Mat *)((long)&(this->weight_winograd63_data).dims +
                       (long)this->_vptr_Convolution_x86_avx[-3]);
      Mat::reshape((Mat *)&pd,pMVar52,uVar22,local_240,*(int *)&pMVar52[-2].data,(Allocator *)0x0);
      uVar61 = 0;
      Mat::create((Mat *)&pd_5,local_240 * uVar22,
                  *(int *)((long)&(this->weight_winograd23_data).dims +
                          (long)this->_vptr_Convolution_x86_avx[-3]),4,(Allocator *)0x0);
      pp_Var14 = this->_vptr_Convolution_x86_avx;
      uVar46 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar46 = uVar61;
      }
      for (; (long)uVar61 <
             (long)*(int *)((long)&(this->weight_winograd23_data).dims + (long)pp_Var14[-3]);
          uVar61 = uVar61 + 1) {
        pp_Var36 = pd_5._vptr_ParamDict;
        for (lVar34 = 0; lVar34 < (long)(lVar39 - (ulong)(uVar27 - 1)); lVar34 = lVar34 + uVar24) {
          pp_Var38 = (_func_int **)
                     ((iStack_19c * lVar34 + local_188[0] * uVar61) * local_1b8 +
                     (long)pd._vptr_ParamDict);
          for (uVar43 = 0; uVar58 = uVar24, pp_Var48 = pp_Var38, uVar43 != uVar46;
              uVar43 = uVar43 + 1) {
            while (uVar58 != 0) {
              *(undefined4 *)pp_Var36 = *(undefined4 *)pp_Var48;
              pp_Var36 = (_func_int **)((long)pp_Var36 + 4);
              uVar58 = uVar58 - 1;
              pp_Var48 = (_func_int **)((long)pp_Var48 + local_1b8 * (long)iStack_19c);
            }
            pp_Var38 = (_func_int **)((long)pp_Var38 + 4);
          }
        }
      }
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1a8 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_1a8->_vptr_Allocator[3])();
          }
        }
      }
      if (*(int *)((long)&(this->weight_winograd43_data).elemsize +
                  (long)this->_vptr_Convolution_x86_avx[-3]) == 0) {
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd.d._4_4_ = pd_5.d._4_4_;
        local_1a8 = (Allocator *)0x0;
        iStack_1a0 = 0;
        iStack_19c = 0;
        uStack_198._0_4_ = 0;
        uStack_198._4_4_ = 0;
        local_190[0] = 0;
        local_188[0] = 0;
        pLVar15 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_60,(Mat *)&pd);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_60);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_60);
        piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_1a8 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
            }
            else {
              (*local_1a8->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_140 = 0;
        local_148 = 0;
        uStack_150 = 0;
        uStack_154 = 0;
        uStack_158 = 0;
        local_160 = 0;
        local_168 = 0;
        local_170 = 0;
        uStack_174 = 0;
        uStack_178 = 0;
        local_188[1] = 0;
        p_Var33 = this->_vptr_Convolution_x86_avx[-3];
        if ((_func_int *)(local_188 + 1) !=
            (_func_int *)((long)&(this->scale_in_data).elempack + (long)p_Var33)) {
          piVar2 = *(int **)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          local_188[1] = *(size_t *)((long)&(this->scale_in_data).elempack + (long)p_Var33);
          uVar7 = *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var33);
          uStack_178 = (undefined4)uVar7;
          uStack_174 = (undefined4)((ulong)uVar7 >> 0x20);
          local_170 = *(undefined8 *)((long)&(this->scale_in_data).dims + (long)p_Var33);
          local_168 = *(undefined4 *)((long)&(this->scale_in_data).h + (long)p_Var33);
          local_160 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var33);
          uVar7 = *(undefined8 *)((long)&(this->scale_in_data).cstep + (long)p_Var33);
          uStack_150 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var33);
          uStack_158 = (undefined4)uVar7;
          uStack_154 = (undefined4)((ulong)uVar7 >> 0x20);
          local_148 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var33);
          local_140 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var33);
        }
        local_188[0] = 0;
        local_190[0] = 0;
        uStack_198._0_4_ = 0;
        uStack_198._4_4_ = 0;
        iStack_19c = 0;
        iStack_1a0 = 0;
        local_1a8 = (Allocator *)0x0;
        pd.d._4_4_ = pd_5.d._4_4_;
        pd.d._0_4_ = pd_5.d._0_4_;
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pLVar15 = this->gemm;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_60,(Mat *)&pd);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_60);
        ModelBinFromMatArray::~ModelBinFromMatArray(&local_60);
        lVar34 = 0x48;
        do {
          piVar2 = *(int **)((long)&pd.d + lVar34);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (*(long **)((long)&local_1a8 + lVar34) == (long *)0x0) {
                free(*(void **)((long)&pd._vptr_ParamDict + lVar34));
              }
              else {
                (**(code **)(**(long **)((long)&local_1a8 + lVar34) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)local_188 + lVar34) = 0;
          *(undefined1 (*) [16])((long)&pd.d + lVar34 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&pd._vptr_ParamDict + lVar34) = (undefined1  [16])0x0;
          *(undefined4 *)((long)local_190 + lVar34) = 0;
          *(undefined1 (*) [16])((long)&iStack_1a0 + lVar34) = (undefined1  [16])0x0;
          lVar34 = lVar34 + -0x48;
        } while (lVar34 != -0x48);
      }
      (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
      piVar2 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          free(pd_5._vptr_ParamDict);
        }
      }
      ParamDict::~ParamDict(&pd_6);
    }
    else {
      local_130 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx + (long)local_130);
      uVar61 = (ulong)(int)uVar22;
      iVar11 = (int)lVar34;
      if ((iVar11 == 8) && (uVar27 == 8)) {
        auVar68 = _DAT_004ef830;
        if (((iVar55 == 2) || (auVar68 = _DAT_004ef840, iVar55 == 3)) && (auVar6 == auVar68)) {
LAB_002074a7:
          if (iVar23 == 1) {
LAB_002074b0:
            uVar12 = iVar42 * iVar55;
            Mat::reshape((Mat *)&pd,(Mat *)(local_130 + 0x160),uVar12,local_240,uVar22,
                         (Allocator *)0x0);
            Mat::create(&this->weight_data_tm,uVar12,
                        (int)((long)((ulong)(uint)((int)local_240 >> 0x1f) << 0x20 | uVar46) /
                             (long)(int)uVar27),(int)uVar22 / iVar11,(ulong)(uVar27 * iVar11 * 4),
                        uVar27 * iVar11,(Allocator *)0x0);
            pvVar37 = (this->weight_data_tm).data;
            sVar3 = (this->weight_data_tm).elemsize;
            sVar4 = (this->weight_data_tm).cstep;
            for (uVar46 = 0; (long)uVar46 < (long)(uVar61 - (iVar11 - 1)); uVar46 = uVar46 + lVar34)
            {
              puVar50 = (undefined4 *)
                        ((long)(int)((long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 |
                                           uVar46 & 0xffffffff) / (long)iVar11) * sVar3 * sVar4 +
                        (long)pvVar37);
              for (lVar67 = 0; lVar67 < (long)(lVar39 - (ulong)(uVar27 - 1));
                  lVar67 = lVar67 + uVar24) {
                lVar44 = 0;
                for (uVar43 = 0; uVar43 != uVar12; uVar43 = uVar43 + 1) {
                  lVar30 = lVar67;
                  for (uVar58 = 0; uVar58 != uVar24; uVar58 = uVar58 + 1) {
                    puVar51 = (undefined4 *)
                              ((long)pd._vptr_ParamDict +
                              (iStack_19c * lVar30 + uVar46 * local_188[0]) * local_1b8 + lVar44);
                    lVar16 = lVar34;
                    while (bVar8 = lVar16 != 0, lVar16 = lVar16 + -1, bVar8) {
                      *puVar50 = *puVar51;
                      puVar50 = puVar50 + 1;
                      puVar51 = (undefined4 *)((long)puVar51 + local_1b8 * local_188[0]);
                    }
                    lVar30 = lVar30 + 1;
                  }
                  lVar44 = lVar44 + 4;
                }
              }
            }
            piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_1a8 == (Allocator *)0x0) {
                  free(pd._vptr_ParamDict);
                }
                else {
                  (*local_1a8->_vptr_Allocator[3])();
                }
              }
            }
            goto LAB_002073da;
          }
        }
      }
      else {
        auVar68 = vpinsrd_avx(auVar6,iVar55,3);
        if ((iVar11 == 8) && (uVar27 == 1)) {
          if (auVar68 == _DAT_004ef820) {
LAB_00207495:
            if (iVar26 == 2) {
              if (iVar23 == 2) goto LAB_002074b0;
            }
            else {
LAB_0020749e:
              if (iVar26 == 1) goto LAB_002074a7;
            }
          }
        }
        else if ((iVar11 == 1) && (uVar27 == 8)) {
          if (auVar68 == _DAT_004ef820) goto LAB_0020749e;
        }
        else {
          auVar68 = vpshufd_avx(auVar6,0x44);
          auVar68 = vpinsrd_avx(auVar68,iVar11,0);
          auVar68 = vpinsrd_avx(auVar68,iVar55,1);
          if ((auVar68 == _DAT_004ef810) && ((auVar6._8_4_ == 1 && (uVar27 == 1))))
          goto LAB_00207495;
        }
      }
      uVar12 = iVar42 * iVar55;
      uVar27 = local_240;
      if ((int)uVar22 < 8) {
        if ((int)uVar22 < 4) {
          if ((int)uVar22 < 2) {
            if ((int)local_240 < 8) {
              if ((int)local_240 < 4) {
                _w = uVar12;
                if (1 < (int)local_240) {
                  _w = uVar12 * 2;
                  uVar27 = (local_240 & 1) + 1;
                }
              }
              else {
                _w = uVar12 * 4;
                uVar27 = (local_240 & 1) + 1 + (uint)((local_240 >> 1 & 1) != 0);
              }
            }
            else {
              _w = uVar12 * 8;
              uVar27 = (local_240 & 1) + (int)(uVar46 >> 3) + ((uint)(uVar46 >> 2) & 1) +
                       (uint)((local_240 >> 1 & 1) != 0);
            }
          }
          else if ((int)local_240 < 8) {
            if ((int)local_240 < 4) {
              if (1 < (int)local_240) {
                _w = uVar12 * 4;
                uVar27 = (local_240 & 1) + 1;
                goto LAB_00207c01;
              }
              uVar22 = (uVar22 & 1) + 1;
              _w = uVar12 * 2;
            }
            else {
              uVar22 = (uVar22 & 1) + 1;
              _w = uVar12 * 8;
              uVar27 = (local_240 & 1) + 1 + (uint)((local_240 >> 1 & 1) != 0);
            }
          }
          else {
            _w = uVar12 * 0x10;
            uVar27 = (local_240 & 1) + (int)(uVar46 >> 3) + ((uint)(uVar46 >> 2) & 1) +
                     (uint)((local_240 >> 1 & 1) != 0);
LAB_00207c01:
            uVar22 = (uVar22 & 1) + 1;
          }
        }
        else {
          if ((int)local_240 < 8) {
            if ((int)local_240 < 4) {
              if ((int)local_240 < 2) {
                _w = uVar12 * 4;
                uVar22 = (uVar22 & 1) + 1 + (uint)((uVar22 >> 1 & 1) != 0);
                goto LAB_00207c0f;
              }
              _w = uVar12 * 8;
              uVar27 = (local_240 & 1) + 1;
            }
            else {
              _w = uVar12 * 0x10;
              uVar27 = (local_240 & 1) + 1 + (uint)((local_240 >> 1 & 1) != 0);
            }
          }
          else {
            _w = uVar12 * 0x20;
            uVar27 = (local_240 & 1) + (int)(uVar46 >> 3) + ((uint)(uVar46 >> 2) & 1) +
                     (uint)((local_240 >> 1 & 1) != 0);
          }
          uVar22 = (uVar22 & 1) + 1 + (uint)((uVar22 >> 1 & 1) != 0);
        }
      }
      else {
        if ((int)local_240 < 8) {
          if ((int)local_240 < 4) {
            if ((int)local_240 < 2) {
              _w = uVar12 * 8;
              uVar22 = (uVar22 & 1) + ((uint)(uVar61 >> 3) & 0x1fffffff) + (uVar22 >> 2 & 1) +
                       (uint)((uVar22 >> 1 & 1) != 0);
              goto LAB_00207c0f;
            }
            _w = uVar12 * 0x10;
            uVar27 = (local_240 & 1) + 1;
          }
          else {
            _w = uVar12 * 0x20;
            uVar27 = (local_240 & 1) + 1 + (uint)((local_240 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar12 * 0x40;
          uVar27 = (local_240 & 1) + (int)(uVar46 >> 3) + ((uint)(uVar46 >> 2) & 1) +
                   (uint)((local_240 >> 1 & 1) != 0);
        }
        uVar22 = (uVar22 & 1) + ((uint)(uVar61 >> 3) & 0x1fffffff) + (uVar22 >> 2 & 1) +
                 (uint)((uVar22 >> 1 & 1) != 0);
      }
LAB_00207c0f:
      Mat::create(&this->weight_data_tm,_w,uVar27,uVar22,4,(Allocator *)0x0);
      lVar34 = *(long *)(local_130 + 0x160);
      local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
      local_40 = (this->weight_data_tm).data;
      local_48 = (long)(int)uVar12;
      uVar24 = 0;
      if (0 < (int)uVar12) {
        uVar24 = (ulong)uVar12;
      }
      uVar22 = uVar12 * local_240;
      local_4c = uVar22 * 8;
      iVar11 = uVar22 * 2;
      iVar55 = uVar22 * 3;
      iVar42 = uVar22 * 7;
      lVar16 = local_48 * 0x20;
      lVar67 = local_48 * 4;
      iVar26 = uVar22 * 6;
      lVar17 = local_48 * 0x10;
      iVar23 = uVar22 * 5;
      iVar56 = uVar22 * 4;
      lVar44 = local_48 * 8;
      lVar30 = uVar24 * 4;
      uVar46 = 0;
      uVar43 = 0;
      while (uVar65 = uVar43, uVar58 = uVar46, uVar47 = (ulong)uVar22,
            (long)(uVar65 | 7) < (long)uVar61) {
        lVar18 = lVar34 + (long)iVar42 * 4;
        lVar28 = lVar34 + (long)iVar26 * 4;
        lVar31 = lVar34 + (long)iVar23 * 4;
        lVar40 = lVar34 + (long)iVar56 * 4;
        lVar49 = lVar34 + (long)iVar55 * 4;
        lVar53 = lVar34 + (long)iVar11 * 4;
        lVar57 = lVar34 + (long)(int)uVar22 * 4;
        lVar66 = lVar34 + (long)(int)uVar58 * 4;
        pvVar37 = (void *)((uVar65 >> 3) * local_38 + (long)local_40);
        lVar63 = 0;
        local_230 = lVar66;
        local_220 = lVar57;
        local_218 = lVar53;
        local_210 = lVar28;
        local_208 = lVar31;
        local_200 = lVar40;
        local_1f8 = lVar49;
        local_1f0 = lVar18;
        for (uVar46 = 0; (long)(uVar46 | 7) < lVar39; uVar46 = uVar46 + 8) {
          lVar62 = lVar63;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            lVar35 = lVar62;
            for (lVar45 = 0; (int)lVar45 != 0x100; lVar45 = lVar45 + 0x20) {
              *(undefined4 *)((long)pvVar37 + lVar45) = *(undefined4 *)(lVar66 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 4) = *(undefined4 *)(lVar57 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 8) = *(undefined4 *)(lVar53 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 0xc) = *(undefined4 *)(lVar49 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 0x10) = *(undefined4 *)(lVar40 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 0x14) = *(undefined4 *)(lVar31 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 0x18) = *(undefined4 *)(lVar28 + lVar35);
              *(undefined4 *)((long)pvVar37 + lVar45 + 0x1c) = *(undefined4 *)(lVar18 + lVar35);
              lVar35 = lVar35 + lVar67;
            }
            lVar62 = lVar62 + 4;
            pvVar37 = (void *)((long)pvVar37 + lVar45);
          }
          lVar63 = lVar63 + lVar16;
          local_1f0 = local_1f0 + lVar16;
          local_210 = local_210 + lVar16;
          local_208 = local_208 + lVar16;
          local_200 = local_200 + lVar16;
          local_1f8 = local_1f8 + lVar16;
          local_218 = local_218 + lVar16;
          local_220 = local_220 + lVar16;
          local_230 = local_230 + lVar16;
        }
        for (; (long)(uVar46 | 3) < lVar39; uVar46 = uVar46 + 4) {
          lVar18 = local_230;
          lVar28 = local_220;
          lVar31 = local_200;
          lVar40 = local_218;
          lVar49 = local_1f8;
          lVar53 = local_210;
          lVar57 = local_1f0;
          lVar66 = local_208;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            lVar62 = 0;
            for (lVar63 = 0; (int)lVar63 != 0x80; lVar63 = lVar63 + 0x20) {
              *(undefined4 *)((long)pvVar37 + lVar63) = *(undefined4 *)(lVar18 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 4) = *(undefined4 *)(lVar28 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 8) = *(undefined4 *)(lVar40 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0xc) = *(undefined4 *)(lVar49 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x10) = *(undefined4 *)(lVar31 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x14) = *(undefined4 *)(lVar66 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x18) = *(undefined4 *)(lVar53 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x1c) = *(undefined4 *)(lVar57 + lVar62);
              lVar62 = lVar62 + lVar67;
            }
            lVar57 = lVar57 + 4;
            lVar53 = lVar53 + 4;
            lVar66 = lVar66 + 4;
            lVar31 = lVar31 + 4;
            lVar49 = lVar49 + 4;
            lVar40 = lVar40 + 4;
            lVar28 = lVar28 + 4;
            lVar18 = lVar18 + 4;
            pvVar37 = (void *)((long)pvVar37 + lVar63);
          }
          local_1f0 = local_1f0 + lVar17;
          local_210 = local_210 + lVar17;
          local_208 = local_208 + lVar17;
          local_200 = local_200 + lVar17;
          local_1f8 = local_1f8 + lVar17;
          local_218 = local_218 + lVar17;
          local_220 = local_220 + lVar17;
          local_230 = local_230 + lVar17;
        }
        for (; (long)(uVar46 | 1) < lVar39; uVar46 = uVar46 + 2) {
          lVar18 = local_230;
          lVar28 = local_1f0;
          lVar31 = local_200;
          lVar40 = local_210;
          lVar49 = local_208;
          lVar53 = local_218;
          lVar57 = local_220;
          lVar66 = local_1f8;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            lVar62 = 0;
            for (lVar63 = 0; (int)lVar63 != 0x40; lVar63 = lVar63 + 0x20) {
              *(undefined4 *)((long)pvVar37 + lVar63) = *(undefined4 *)(lVar18 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 4) = *(undefined4 *)(lVar57 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 8) = *(undefined4 *)(lVar53 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0xc) = *(undefined4 *)(lVar66 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x10) = *(undefined4 *)(lVar31 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x14) = *(undefined4 *)(lVar49 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x18) = *(undefined4 *)(lVar40 + lVar62);
              *(undefined4 *)((long)pvVar37 + lVar63 + 0x1c) = *(undefined4 *)(lVar28 + lVar62);
              lVar62 = lVar62 + lVar67;
            }
            lVar57 = lVar57 + 4;
            lVar53 = lVar53 + 4;
            lVar66 = lVar66 + 4;
            lVar31 = lVar31 + 4;
            lVar49 = lVar49 + 4;
            lVar40 = lVar40 + 4;
            lVar28 = lVar28 + 4;
            lVar18 = lVar18 + 4;
            pvVar37 = (void *)((long)pvVar37 + lVar63);
          }
          local_220 = local_220 + lVar44;
          local_218 = local_218 + lVar44;
          local_1f8 = local_1f8 + lVar44;
          local_200 = local_200 + lVar44;
          local_208 = local_208 + lVar44;
          local_210 = local_210 + lVar44;
          local_1f0 = local_1f0 + lVar44;
          local_230 = local_230 + lVar44;
        }
        for (; (long)uVar46 < lVar39; uVar46 = uVar46 + 1) {
          pvVar19 = pvVar37;
          for (lVar18 = 0; lVar30 != lVar18; lVar18 = lVar18 + 4) {
            *(undefined4 *)((long)pvVar37 + lVar18 * 8) = *(undefined4 *)(local_230 + lVar18);
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 4) = *(undefined4 *)(local_220 + lVar18);
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 8) = *(undefined4 *)(local_218 + lVar18);
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 0xc) = *(undefined4 *)(local_1f8 + lVar18);
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 0x10) = *(undefined4 *)(local_200 + lVar18)
            ;
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 0x14) = *(undefined4 *)(local_208 + lVar18)
            ;
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 0x18) = *(undefined4 *)(local_210 + lVar18)
            ;
            *(undefined4 *)((long)pvVar37 + lVar18 * 8 + 0x1c) = *(undefined4 *)(local_1f0 + lVar18)
            ;
            pvVar19 = (void *)((long)pvVar19 + 0x20);
          }
          local_1f0 = local_1f0 + lVar67;
          local_210 = local_210 + lVar67;
          local_208 = local_208 + lVar67;
          local_200 = local_200 + lVar67;
          local_1f8 = local_1f8 + lVar67;
          local_218 = local_218 + lVar67;
          local_220 = local_220 + lVar67;
          local_230 = local_230 + lVar67;
          pvVar37 = pvVar19;
        }
        uVar22 = uVar22 + local_4c;
        iVar11 = iVar11 + local_4c;
        iVar55 = iVar55 + local_4c;
        iVar42 = iVar42 + local_4c;
        iVar26 = iVar26 + local_4c;
        iVar23 = iVar23 + local_4c;
        iVar56 = iVar56 + local_4c;
        uVar46 = (ulong)(uint)((int)uVar58 + local_4c);
        local_118 = uVar47;
        local_110 = uVar65;
        local_108 = uVar58;
        uVar43 = uVar65 + 8;
      }
      lVar34 = *(long *)(local_130 + 0x160);
      pvVar37 = (this->weight_data_tm).data;
      sVar3 = (this->weight_data_tm).elemsize;
      sVar4 = (this->weight_data_tm).cstep;
      iVar23 = local_240 * uVar12;
      iVar26 = iVar23 * 4;
      while (uVar41 = uVar65, uVar46 = uVar47, uVar43 = uVar58, (long)(uVar41 | 3) < (long)uVar61) {
        lVar18 = lVar34 + (long)(int)uVar43 * 4;
        lVar28 = lVar34 + (long)(int)uVar46 * 4;
        lVar31 = lVar34 + (long)iVar11 * 4;
        lVar40 = lVar34 + (long)iVar55 * 4;
        puVar50 = (undefined4 *)
                  ((ulong)(((uint)(uVar41 >> 3) & 0x1fffffff) + (uint)(((uint)uVar41 >> 2 & 1) != 0)
                          ) * sVar3 * sVar4 + (long)pvVar37);
        lVar63 = 0;
        lVar49 = lVar40;
        lVar53 = lVar18;
        lVar57 = lVar31;
        lVar66 = lVar28;
        for (uVar58 = 0; (long)(uVar58 | 7) < lVar39; uVar58 = uVar58 + 8) {
          lVar62 = lVar63;
          for (uVar47 = 0; uVar47 != uVar24; uVar47 = uVar47 + 1) {
            lVar35 = lVar62;
            for (lVar45 = 0; (int)lVar45 != 0x80; lVar45 = lVar45 + 0x10) {
              *(undefined4 *)((long)puVar50 + lVar45) = *(undefined4 *)(lVar18 + lVar35);
              *(undefined4 *)((long)puVar50 + lVar45 + 4) = *(undefined4 *)(lVar28 + lVar35);
              *(undefined4 *)((long)puVar50 + lVar45 + 8) = *(undefined4 *)(lVar31 + lVar35);
              *(undefined4 *)((long)puVar50 + lVar45 + 0xc) = *(undefined4 *)(lVar40 + lVar35);
              lVar35 = lVar35 + lVar67;
            }
            puVar50 = (undefined4 *)((long)puVar50 + lVar45);
            lVar62 = lVar62 + 4;
          }
          lVar63 = lVar63 + lVar16;
          lVar53 = lVar53 + lVar16;
          lVar66 = lVar66 + lVar16;
          lVar57 = lVar57 + lVar16;
          lVar49 = lVar49 + lVar16;
        }
        for (; (long)(uVar58 | 3) < lVar39; uVar58 = uVar58 + 4) {
          lVar18 = lVar49;
          lVar28 = lVar53;
          lVar31 = lVar57;
          lVar40 = lVar66;
          for (uVar47 = 0; uVar47 != uVar24; uVar47 = uVar47 + 1) {
            lVar62 = 0;
            for (lVar63 = 0; (int)lVar63 != 0x40; lVar63 = lVar63 + 0x10) {
              *(undefined4 *)((long)puVar50 + lVar63) = *(undefined4 *)(lVar28 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 4) = *(undefined4 *)(lVar40 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 8) = *(undefined4 *)(lVar31 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 0xc) = *(undefined4 *)(lVar18 + lVar62);
              lVar62 = lVar62 + lVar67;
            }
            puVar50 = (undefined4 *)((long)puVar50 + lVar63);
            lVar28 = lVar28 + 4;
            lVar40 = lVar40 + 4;
            lVar31 = lVar31 + 4;
            lVar18 = lVar18 + 4;
          }
          lVar53 = lVar53 + lVar17;
          lVar66 = lVar66 + lVar17;
          lVar57 = lVar57 + lVar17;
          lVar49 = lVar49 + lVar17;
        }
        for (; (long)(uVar58 | 1) < lVar39; uVar58 = uVar58 + 2) {
          lVar18 = lVar49;
          lVar28 = lVar53;
          lVar31 = lVar57;
          lVar40 = lVar66;
          for (uVar47 = 0; uVar47 != uVar24; uVar47 = uVar47 + 1) {
            lVar62 = 0;
            for (lVar63 = 0; (int)lVar63 != 0x20; lVar63 = lVar63 + 0x10) {
              *(undefined4 *)((long)puVar50 + lVar63) = *(undefined4 *)(lVar28 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 4) = *(undefined4 *)(lVar40 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 8) = *(undefined4 *)(lVar31 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar63 + 0xc) = *(undefined4 *)(lVar18 + lVar62);
              lVar62 = lVar62 + lVar67;
            }
            puVar50 = (undefined4 *)((long)puVar50 + lVar63);
            lVar28 = lVar28 + 4;
            lVar40 = lVar40 + 4;
            lVar31 = lVar31 + 4;
            lVar18 = lVar18 + 4;
          }
          lVar53 = lVar53 + lVar44;
          lVar66 = lVar66 + lVar44;
          lVar57 = lVar57 + lVar44;
          lVar49 = lVar49 + lVar44;
        }
        for (; (long)uVar58 < lVar39; uVar58 = uVar58 + 1) {
          for (uVar47 = 0; uVar24 != uVar47; uVar47 = uVar47 + 1) {
            *puVar50 = *(undefined4 *)(lVar53 + uVar47 * 4);
            puVar50[1] = *(undefined4 *)(lVar66 + uVar47 * 4);
            puVar50[2] = *(undefined4 *)(lVar57 + uVar47 * 4);
            puVar50[3] = *(undefined4 *)(lVar49 + uVar47 * 4);
            puVar50 = puVar50 + 4;
          }
          lVar49 = lVar49 + lVar67;
          lVar57 = lVar57 + lVar67;
          lVar66 = lVar66 + lVar67;
          lVar53 = lVar53 + lVar67;
        }
        iVar11 = iVar11 + iVar26;
        iVar55 = iVar55 + iVar26;
        uVar58 = (ulong)(uint)((int)uVar43 + iVar26);
        uVar47 = (ulong)(uint)((int)uVar46 + iVar26);
        local_118 = uVar46;
        local_110 = uVar41;
        local_108 = uVar43;
        uVar65 = uVar41 + 4;
      }
      lVar53 = *(long *)(local_130 + 0x160);
      local_120 = (this->weight_data_tm).data;
      local_128 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
      lVar34 = lVar53 + (long)(int)(uVar12 * 7) * 4;
      lVar18 = lVar53 + (long)(int)(uVar12 * 6) * 4;
      lVar28 = lVar53 + (long)(int)(uVar12 * 5) * 4;
      local_100 = lVar53 + (long)(int)(uVar12 * 4) * 4;
      lVar31 = lVar53 + (long)(int)(uVar12 * 3) * 4;
      lVar40 = lVar53 + (long)(int)(uVar12 * 2) * 4;
      lVar49 = lVar53 + local_48 * 4;
      while (uVar65 = uVar41, uVar58 = uVar43, uVar47 = uVar46, (long)(uVar65 | 1) < (long)uVar61) {
        iVar55 = (int)uVar47;
        lVar66 = (long)iVar55;
        local_230 = lVar34 + lVar66 * 4;
        local_220 = lVar18 + lVar66 * 4;
        local_218 = lVar28 + lVar66 * 4;
        local_1f8 = local_100 + lVar66 * 4;
        lVar32 = lVar31 + lVar66 * 4;
        lVar64 = lVar40 + lVar66 * 4;
        lVar57 = lVar49 + lVar66 * 4;
        lVar66 = lVar53 + lVar66 * 4;
        lVar45 = (long)(int)uVar58;
        local_200 = lVar34 + lVar45 * 4;
        local_208 = lVar18 + lVar45 * 4;
        lVar63 = lVar28 + lVar45 * 4;
        lVar62 = local_100 + lVar45 * 4;
        lVar54 = lVar45 * 4 + lVar31;
        lVar59 = lVar40 + lVar45 * 4;
        lVar35 = lVar49 + lVar45 * 4;
        lVar45 = lVar53 + lVar45 * 4;
        puVar50 = (undefined4 *)
                  ((ulong)(((uint)(uVar65 >> 2) & 1) + ((uint)(uVar65 >> 3) & 0x1fffffff) +
                          (uint)(((uint)uVar65 >> 1 & 1) != 0)) * local_128 + (long)local_120);
        for (uVar46 = 0; (long)(uVar46 | 7) < lVar39; uVar46 = uVar46 + 8) {
          for (lVar20 = 0; lVar30 != lVar20; lVar20 = lVar20 + 4) {
            *puVar50 = *(undefined4 *)(lVar45 + lVar20);
            puVar50[1] = *(undefined4 *)(lVar35 + lVar20);
            puVar50[2] = *(undefined4 *)(lVar59 + lVar20);
            puVar50[3] = *(undefined4 *)(lVar54 + lVar20);
            puVar50[4] = *(undefined4 *)(lVar62 + lVar20);
            puVar50[5] = *(undefined4 *)(lVar63 + lVar20);
            puVar50[6] = *(undefined4 *)(local_208 + lVar20);
            puVar50[7] = *(undefined4 *)(local_200 + lVar20);
            puVar50[8] = *(undefined4 *)(lVar66 + lVar20);
            puVar50[9] = *(undefined4 *)(lVar57 + lVar20);
            puVar50[10] = *(undefined4 *)(lVar64 + lVar20);
            puVar50[0xb] = *(undefined4 *)(lVar32 + lVar20);
            puVar50[0xc] = *(undefined4 *)(local_1f8 + lVar20);
            puVar50[0xd] = *(undefined4 *)(local_218 + lVar20);
            puVar50[0xe] = *(undefined4 *)(local_220 + lVar20);
            puVar50[0xf] = *(undefined4 *)(local_230 + lVar20);
            puVar50 = puVar50 + 0x10;
          }
          local_230 = local_230 + lVar16;
          local_220 = local_220 + lVar16;
          local_218 = local_218 + lVar16;
          local_1f8 = local_1f8 + lVar16;
          lVar32 = lVar32 + lVar16;
          lVar64 = lVar64 + lVar16;
          lVar57 = lVar57 + lVar16;
          lVar66 = lVar66 + lVar16;
          local_200 = local_200 + lVar16;
          local_208 = local_208 + lVar16;
          lVar63 = lVar63 + lVar16;
          lVar62 = lVar62 + lVar16;
          lVar54 = lVar54 + lVar16;
          lVar59 = lVar59 + lVar16;
          lVar35 = lVar35 + lVar16;
          lVar45 = lVar45 + lVar16;
        }
        for (; (long)(uVar46 | 3) < lVar39; uVar46 = uVar46 + 4) {
          puVar51 = puVar50;
          for (lVar63 = 0; lVar30 != lVar63; lVar63 = lVar63 + 4) {
            puVar50[lVar63 * 2] = *(undefined4 *)(lVar45 + lVar63);
            puVar50[lVar63 * 2 + 1] = *(undefined4 *)(lVar35 + lVar63);
            puVar50[lVar63 * 2 + 2] = *(undefined4 *)(lVar59 + lVar63);
            puVar50[lVar63 * 2 + 3] = *(undefined4 *)(lVar54 + lVar63);
            puVar50[lVar63 * 2 + 4] = *(undefined4 *)(lVar66 + lVar63);
            puVar50[lVar63 * 2 + 5] = *(undefined4 *)(lVar57 + lVar63);
            puVar50[lVar63 * 2 + 6] = *(undefined4 *)(lVar64 + lVar63);
            puVar50[lVar63 * 2 + 7] = *(undefined4 *)(lVar32 + lVar63);
            puVar51 = puVar51 + 8;
          }
          lVar32 = lVar32 + lVar17;
          lVar64 = lVar64 + lVar17;
          lVar57 = lVar57 + lVar17;
          lVar66 = lVar66 + lVar17;
          lVar54 = lVar54 + lVar17;
          lVar59 = lVar59 + lVar17;
          lVar35 = lVar35 + lVar17;
          lVar45 = lVar45 + lVar17;
          puVar50 = puVar51;
        }
        for (; (long)(uVar46 | 1) < lVar39; uVar46 = uVar46 + 2) {
          lVar57 = lVar66;
          lVar63 = lVar45;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            lVar62 = 0;
            for (lVar35 = 0; (int)lVar35 != 0x10; lVar35 = lVar35 + 8) {
              *(undefined4 *)((long)puVar50 + lVar35) = *(undefined4 *)(lVar63 + lVar62);
              *(undefined4 *)((long)puVar50 + lVar35 + 4) = *(undefined4 *)(lVar57 + lVar62);
              lVar62 = lVar62 + lVar67;
            }
            puVar50 = (undefined4 *)((long)puVar50 + lVar35);
            lVar63 = lVar63 + 4;
            lVar57 = lVar57 + 4;
          }
          lVar45 = lVar45 + lVar44;
          lVar66 = lVar66 + lVar44;
        }
        for (; (long)uVar46 < lVar39; uVar46 = uVar46 + 1) {
          for (uVar43 = 0; uVar24 != uVar43; uVar43 = uVar43 + 1) {
            *puVar50 = *(undefined4 *)(lVar45 + uVar43 * 4);
            puVar50[1] = *(undefined4 *)(lVar66 + uVar43 * 4);
            puVar50 = puVar50 + 2;
          }
          lVar66 = lVar66 + lVar67;
          lVar45 = lVar45 + lVar67;
        }
        uVar46 = (ulong)(uint)(iVar55 + iVar23 * 2);
        uVar43 = (ulong)(uint)((int)uVar58 + iVar23 * 2);
        local_118 = uVar47;
        local_110 = uVar65;
        local_108 = uVar58;
        uVar41 = uVar65 + 2;
      }
      lVar34 = *(long *)(local_130 + 0x160);
      pvVar37 = (this->weight_data_tm).data;
      sVar3 = (this->weight_data_tm).elemsize;
      sVar4 = (this->weight_data_tm).cstep;
      for (; (long)uVar65 < (long)uVar61; uVar65 = uVar65 + 1) {
        iVar55 = (int)uVar58;
        lVar67 = lVar34 + local_48 * 4 + (long)iVar55 * 4;
        puVar50 = (undefined4 *)(lVar34 + (long)iVar55 * 4);
        puVar51 = (undefined4 *)
                  ((ulong)(((uint)uVar65 & 1) + ((uint)(uVar65 >> 3) & 0x1fffffff) +
                           ((uint)(uVar65 >> 2) & 1) + (uint)(((uint)uVar65 >> 1 & 1) != 0)) *
                   sVar3 * sVar4 + (long)pvVar37);
        for (uVar46 = 0; (long)(uVar46 | 7) < lVar39; uVar46 = uVar46 + 8) {
          puVar29 = puVar50;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            puVar60 = puVar29;
            for (lVar18 = 0; (int)lVar18 != 0x20; lVar18 = lVar18 + 4) {
              *(undefined4 *)((long)puVar51 + lVar18) = *puVar60;
              puVar60 = puVar60 + local_48;
            }
            puVar51 = (undefined4 *)((long)puVar51 + lVar18);
            puVar29 = puVar29 + 1;
          }
          puVar50 = puVar50 + local_48 * 8;
          lVar67 = lVar67 + lVar16;
        }
        for (; (long)(uVar46 | 3) < lVar39; uVar46 = uVar46 + 4) {
          puVar29 = puVar50;
          for (uVar43 = 0; uVar43 != uVar24; uVar43 = uVar43 + 1) {
            puVar60 = puVar29;
            for (lVar18 = 0; (int)lVar18 != 0x10; lVar18 = lVar18 + 4) {
              *(undefined4 *)((long)puVar51 + lVar18) = *puVar60;
              puVar60 = puVar60 + local_48;
            }
            puVar51 = (undefined4 *)((long)puVar51 + lVar18);
            puVar29 = puVar29 + 1;
          }
          puVar50 = puVar50 + local_48 * 4;
          lVar67 = lVar67 + lVar17;
        }
        for (; (long)(uVar46 | 1) < lVar39; uVar46 = uVar46 + 2) {
          for (uVar43 = 0; uVar24 != uVar43; uVar43 = uVar43 + 1) {
            *puVar51 = puVar50[uVar43];
            puVar51[1] = *(undefined4 *)(lVar67 + uVar43 * 4);
            puVar51 = puVar51 + 2;
          }
          lVar67 = lVar67 + lVar44;
          puVar50 = puVar50 + local_48 * 2;
        }
        for (; (long)uVar46 < lVar39; uVar46 = uVar46 + 1) {
          for (lVar67 = 0; lVar30 != lVar67; lVar67 = lVar67 + 4) {
            *(undefined4 *)((long)puVar51 + lVar67) = *(undefined4 *)((long)puVar50 + lVar67);
          }
          puVar50 = puVar50 + local_48;
          puVar51 = (undefined4 *)((long)puVar51 + lVar67);
        }
        uVar58 = (ulong)(uint)(iVar55 + iVar23);
      }
    }
LAB_002073da:
    cVar1 = opt->lightmode;
    goto LAB_002073e2;
  }
  lVar34 = *(long *)((long)&(this->weight_sgemm_data).cstep + (long)p_Var33);
  if (((lVar34 == *(long *)((long)&(this->weight_winograd23_data).data + (long)p_Var33)) ||
      (*(int *)(lVar34 + 0x2c) == 0)) || (*(int *)(lVar34 + 0x30) == 0)) {
    lVar39 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
    lVar67 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
    if (((lVar39 != lVar67) && (*(int *)(lVar39 + 0x2c) != 0)) && (*(int *)(lVar39 + 0x30) != 0))
    goto LAB_00207694;
    if ((((int)uVar22 < 0x21) && (opt->use_winograd63_convolution != false)) &&
       ((int)local_240 < 0x21)) {
LAB_002077c0:
      conv3x3s1_winograd63_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                 &this->weight_winograd63_data,local_240,uVar22,opt);
    }
    else {
      pMVar52 = (Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33);
      if (opt->use_winograd43_convolution == true) {
        conv3x3s1_winograd43_transform_kernel
                  (pMVar52,&this->weight_winograd43_data,local_240,uVar22,opt);
      }
      else {
        conv3x3s1_winograd23_transform_kernel
                  (pMVar52,&this->weight_winograd23_data,local_240,uVar22,opt);
      }
    }
    goto LAB_00208d6d;
  }
  lVar39 = *(long *)((long)&(this->weight_winograd23_data).elemsize + (long)p_Var33);
  lVar67 = *(long *)((long)&(this->weight_winograd23_data).elempack + (long)p_Var33);
LAB_00207694:
  if (((lVar39 == lVar67) || (iVar55 = *(int *)(lVar39 + 0x2c), iVar55 == 0)) ||
     (iVar23 = *(int *)(lVar39 + 0x30), iVar23 == 0)) {
    iVar55 = *(int *)(lVar34 + 0x2c);
    iVar23 = *(int *)(lVar34 + 0x30);
    uVar24 = *(ulong *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var33 + 4));
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar24;
    auVar6 = vpcmpgtd_avx(auVar68,(undefined1  [16])0x0);
    auVar6 = vpmovsxdq_avx(auVar6);
    if ((((auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar6[0xf]) &&
        (iVar11 = *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var33 + 4)),
        iVar11 < 1)) &&
       (iVar26 = *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33),
       iVar26 < 1)) {
      auVar6 = vpinsrd_avx(auVar68,iVar11,2);
      auVar6 = vpinsrd_avx(auVar6,iVar26,3);
      auVar69._8_4_ = 0xffffff17;
      auVar69._0_8_ = 0xffffff17ffffff17;
      auVar69._12_4_ = 0xffffff17;
      if (auVar6 != auVar69) {
        auVar70._8_4_ = 0xffffff16;
        auVar70._0_8_ = 0xffffff16ffffff16;
        auVar70._12_4_ = 0xffffff16;
        auVar6 = vpcmpeqd_avx(auVar6,auVar70);
        uVar13 = vmovmskps_avx(auVar6);
        if ((char)uVar13 != '\x0f') goto LAB_00207b2d;
      }
      goto LAB_002076b5;
    }
    iVar55 = iVar55 + (int)(uVar24 >> 0x20) + (int)uVar24;
    iVar23 = iVar23 + *(int *)((long)&(this->weight_winograd43_data).data + (long)(p_Var33 + 4)) +
             *(int *)((long)&(this->weight_winograd43_data).refcount + (long)p_Var33);
  }
  else {
LAB_002076b5:
    iVar55 = iVar55 + 2;
    iVar23 = iVar23 + 2;
  }
LAB_00207b2d:
  bVar8 = test_prefer_winograd63(local_240,uVar22,iVar55,iVar23);
  bVar9 = test_prefer_winograd23(local_240,uVar22,iVar55,iVar23);
  bVar21 = bVar9 & bVar25;
  if (!bVar9) {
    bVar25 = bVar8;
  }
  if (bVar8) {
    bVar10 = opt->use_winograd63_convolution;
    if ((bVar25 & bVar10) != 0) goto LAB_00207bce;
LAB_00208d00:
    if (opt->use_winograd43_convolution == false) {
      if (bVar21 != 0 || opt->use_winograd63_convolution != true) goto LAB_00208d41;
      if (bVar10 != 0 || opt->use_winograd63_convolution != false) goto LAB_002077c0;
    }
    else {
      if (bVar21 != 0) goto LAB_00208d41;
      conv3x3s1_winograd43_transform_kernel
                ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
                 &this->weight_winograd43_data,local_240,uVar22,opt);
    }
  }
  else {
    if (bVar25 == 0) {
      bVar10 = 0;
      goto LAB_00208d00;
    }
LAB_00207bce:
    if (bVar21 == 0) {
      if (bVar8) goto LAB_002077c0;
      goto LAB_00208d6d;
    }
LAB_00208d41:
    conv3x3s1_winograd23_transform_kernel
              ((Mat *)((long)&(this->weight_winograd63_data).dims + (long)p_Var33),
               &this->weight_winograd23_data,local_240,uVar22,opt);
  }
LAB_00208d6d:
  cVar1 = opt->lightmode;
LAB_002073e2:
  if (cVar1 == '\x01') {
    p_Var33 = this->_vptr_Convolution_x86_avx[-3];
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).h + (long)p_Var33);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        plVar5 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var33);
        if (plVar5 == (long *)0x0) {
          free(*(void **)((long)&(this->weight_winograd63_data).dims + (long)p_Var33));
        }
        else {
          (**(code **)(*plVar5 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var33) = 0;
    *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).d + (long)p_Var33) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&(this->weight_winograd63_data).dims + (long)p_Var33) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)&this->gemm + (long)p_Var33) = (undefined1  [16])0x0;
    *(undefined4 *)((long)&(this->scale_in_data).refcount + (long)p_Var33) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else
    {
        if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
                || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}